

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::move_from
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,
          Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *complex_source)

{
  stored_size_type sVar1;
  Siblings *pSVar2;
  Dictionary *pDVar3;
  Siblings *pSVar4;
  invalid_argument *this_00;
  long lVar5;
  Siblings *pSVar6;
  
  this->null_vertex_ = complex_source->null_vertex_;
  (this->root_).oncles_ = (complex_source->root_).oncles_;
  (this->root_).parent_ = (complex_source->root_).parent_;
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
  ::Data::operator=((Data *)&(this->root_).members_,(Data *)&(complex_source->root_).members_);
  std::
  vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ::_M_move_assign(&this->filtration_vect_,&complex_source->filtration_vect_);
  this->dimension_ = complex_source->dimension_;
  sVar1 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar1 != 0) {
    pDVar3 = (Dictionary *)
             &((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start)->second;
    lVar5 = sVar1 * 0x18;
    do {
      pSVar4 = (Siblings *)((long)pDVar3 + 8);
      if (pSVar4 == (Siblings *)0x10) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, false>::operator*() const [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, IsConst = false]"
                     );
      }
      pSVar2 = pSVar4->oncles_;
      pSVar6 = pSVar2;
      if ((pSVar2 == &complex_source->root_) &&
         (pSVar6 = pSVar4, pSVar2->oncles_ != (Siblings *)0x0)) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this_00,"Simplex_tree move constructor from an invalid Simplex_tree");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pSVar6->oncles_ = &this->root_;
      pDVar3 = &pSVar4->members_;
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void move_from(Simplex_tree& complex_source) {
    null_vertex_ = std::move(complex_source.null_vertex_);
    root_ = std::move(complex_source.root_);
    filtration_vect_ = std::move(complex_source.filtration_vect_);
    dimension_ = complex_source.dimension_;
    if constexpr (Options::link_nodes_by_label) {
      nodes_label_to_list_.swap(complex_source.nodes_label_to_list_);
    }
    // Need to update root members (children->oncles and children need to point on the new root pointer)
    for (auto& map_el : root_.members()) {
      if (map_el.second.children() != &(complex_source.root_)) {
        // reset children->oncles with the moved root_ pointer value
        map_el.second.children()->oncles_ = &root_;
      } else {
        // if simplex is of dimension 0, oncles_ shall be nullptr
        GUDHI_CHECK(map_el.second.children()->oncles_ == nullptr,
                    std::invalid_argument("Simplex_tree move constructor from an invalid Simplex_tree"));
        // and children points on root_ - to be moved
        map_el.second.assign_children(&root_);
      }
    }
  }